

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void __thiscall
duckdb::WindowQuantileState<duckdb::interval_t>::SkipListUpdater::Left
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  unsigned_long *puVar1;
  CURSOR_TYPE *pCVar2;
  SkipListType *__filename;
  CursorType *pCVar3;
  ColumnDataScanState *pCVar4;
  reference pvVar5;
  
  if (begin < end) {
    do {
      puVar1 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pCVar2 = this->included->dmask;
        pCVar4 = (ColumnDataScanState *)(pCVar2->scan).current_row_index;
        if (begin < pCVar4 || (ColumnDataScanState *)(pCVar2->scan).next_row_index <= begin) {
          duckdb::ColumnDataCollection::Seek
                    ((ulong)pCVar2->inputs,(ColumnDataScanState *)begin,(DataChunk *)&pCVar2->scan);
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
          pCVar2->data = *(interval_t **)(pvVar5 + 0x20);
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pCVar2->page,0);
          FlatVector::VerifyFlatVector(pvVar5);
          pvVar5 = pvVar5 + 0x28;
          pCVar2->validity = (ValidityMask *)pvVar5;
          pCVar4 = (ColumnDataScanState *)(pCVar2->scan).current_row_index;
        }
        else {
          pvVar5 = (reference)pCVar2->validity;
        }
        if ((*(long *)pvVar5 == 0) ||
           ((*(ulong *)(*(long *)pvVar5 + (begin - (long)pCVar4 >> 6 & 0x3ffffff) * 8) >>
             (begin - (long)pCVar4 & 0x3f) & 1) != 0)) {
          __filename = this->skip;
          pCVar3 = this->data;
          if ((ColumnDataScanState *)(pCVar3->scan).next_row_index <= begin ||
              begin < (ColumnDataScanState *)(pCVar3->scan).current_row_index) {
            duckdb::ColumnDataCollection::Seek
                      ((ulong)pCVar3->inputs,(ColumnDataScanState *)begin,(DataChunk *)&pCVar3->scan
                      );
            pvVar5 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
            pCVar3->data = *(interval_t **)(pvVar5 + 0x20);
            pvVar5 = vector<duckdb::Vector,_true>::operator[]
                               ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
            FlatVector::VerifyFlatVector(pvVar5);
            pCVar3->validity = (ValidityMask *)(pvVar5 + 0x28);
          }
          duckdb_skiplistlib::skip_list::
          HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
          ::remove((HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                    *)&stack0xffffffffffffffb8,(char *)__filename);
        }
      }
      begin = (long)&(((ColumnDataScanState *)begin)->current_chunk_state).handles._M_h._M_buckets +
              1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.remove(SkipType(begin, data[begin]));
				}
			}
		}